

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

bool __thiscall Api::interpret(Api *this,string *str)

{
  bool bVar1;
  string *str_local;
  Api *this_local;
  
  bVar1 = std::operator==(str,"REMAINING CARD");
  if (bVar1) {
    getRemainCard(this,0,true);
    getRemainCard(this,1,true);
  }
  else {
    bVar1 = std::operator==(str,"BOARD");
    if (bVar1) {
      getBoardPlayer(this,0,true);
      getBoardPlayer(this,1,true);
    }
    else {
      bVar1 = std::operator==(str,"HAND");
      if (bVar1) {
        getCurrentHand(this,true);
      }
      else {
        bVar1 = std::operator==(str,"END");
        if (!bVar1) {
          return false;
        }
        endTurn(this);
      }
    }
  }
  return true;
}

Assistant:

bool Api::interpret(std::string str) {

    if (str == "REMAINING CARD") {
        this->getRemainCard(0, true);
        this->getRemainCard(1, true);
    } else if (str == "BOARD") {
        this->getBoardPlayer(0, true);
        this->getBoardPlayer(1, true);
    } else if (str == "HAND") {
        this->getCurrentHand(true);
    } else if (str == "END") {
        this->endTurn();
    } else {
        return false;
    }
    return true;
}